

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O1

void __thiscall
StrongConnectedComponents::getStrongConnectedComponents(StrongConnectedComponents *this,int root)

{
  ulong *puVar1;
  iterator __position;
  pointer pvVar2;
  int iVar3;
  long lVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  int *piVar6;
  ulong uVar7;
  pointer piVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  int next;
  int w;
  int local_50;
  int local_4c;
  value_type local_48;
  
  iVar3 = this->sccCounter + 1;
  this->sccCounter = iVar3;
  (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[root] = iVar3;
  (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[root] = this->sccCounter;
  uVar7 = (ulong)root;
  uVar11 = uVar7 + 0x3f;
  if (-1 < (long)uVar7) {
    uVar11 = uVar7;
  }
  puVar1 = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar11 >> 6) +
           (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)root & 0x3f);
  __position._M_current =
       (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_50 = root;
  if (__position._M_current ==
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->stack,__position,&local_50);
  }
  else {
    *__position._M_current = root;
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  lVar4 = (long)local_50;
  pvVar2 = (this->adjList).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar8 = pvVar2[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar8) {
    uVar11 = 0;
    do {
      iVar3 = piVar8[uVar11];
      uVar10 = (ulong)iVar3;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar3);
      uVar7 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar7 = uVar10;
      }
      if (((this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) +
            (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar10 & 0x3f) & 1) == 0) {
        getStrongConnectedComponents(this,iVar3);
        piVar8 = (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = piVar8 + local_50;
        piVar9 = piVar8 + (int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
LAB_00180a74:
        iVar3 = *piVar6;
        if (*piVar9 < *piVar6) {
          iVar3 = *piVar9;
        }
        *piVar6 = iVar3;
      }
      else {
        piVar8 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar8[uVar10] < piVar8[lVar4]) {
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_48);
          if (_Var5._M_current !=
              (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            piVar6 = (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + local_50;
            piVar9 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     (int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            goto LAB_00180a74;
          }
        }
      }
      uVar11 = uVar11 + 1;
      lVar4 = (long)local_50;
      pvVar2 = (this->adjList).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = pvVar2[lVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar2[lVar4].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar8 >> 2));
  }
  if (((this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[lVar4] ==
       (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[lVar4]) &&
     ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    do {
      piVar8 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_4c = piVar8[-1];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar8 + -1;
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_48,
                   (iterator)
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_4c);
      }
      else {
        *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_4c;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      piVar8 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (piVar8[local_50] < piVar8[local_4c]);
    if (4 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&this->currentSCCs,&local_48);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void StrongConnectedComponents::getStrongConnectedComponents(int root) {
    sccCounter++;
    lowlink[root] = sccCounter;
    number[root] = sccCounter;
    visited[root] = true;
    stack.push_back(root);

    for (int i = 0; i < adjList[root].size(); i++) {
        int w = adjList[root][i];
        if (!visited[w]) {
            getStrongConnectedComponents(w);
            lowlink[root] = std::min(lowlink[root], lowlink[w]);
        }
        else if (number[w] < number[root]) {
            if (find_vec(stack, w)) {
                lowlink[root] = std::min(lowlink[root], number[w]);
            }
        }
    }

    if ((lowlink[root] == number[root]) && !stack.empty()) {
        int next;
        std::vector<int> scc;

        do {
            next = stack.back();
            stack.pop_back();
            scc.push_back(next);
        } while (number[next] > number[root]);

        if (scc.size() > 1) {
            currentSCCs.push_back(scc);
        }
    }
}